

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_DeriveWeights(Vec_Int_t *vDivs,Acb_Ntk_t *pNtkF)

{
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  p = Vec_IntAlloc(vDivs->nSize);
  for (i = 0; i < vDivs->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vDivs,i);
    iVar1 = Vec_IntEntry(&pNtkF->vObjWeight,iVar1);
    Vec_IntPush(p,iVar1);
  }
  return p;
}

Assistant:

Vec_Int_t * Acb_DeriveWeights( Vec_Int_t * vDivs, Acb_Ntk_t * pNtkF )
{
    int i, iDiv;
    Vec_Int_t * vWeights = Vec_IntAlloc( Vec_IntSize(vDivs) );
    Vec_IntForEachEntry( vDivs, iDiv, i )
        Vec_IntPush( vWeights, Vec_IntEntry(&pNtkF->vObjWeight, iDiv) );
    return vWeights;
}